

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int ns_is_error(int n)

{
  int iVar1;
  int *piVar2;
  
  if (n != 0) {
    if (-1 < n) {
      return 0;
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (iVar1 == 4) {
      return 0;
    }
    if (iVar1 == 0xb) {
      return 0;
    }
    if (iVar1 == 0x73) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int ns_is_error(int n) {
  return n == 0 ||
    (n < 0 && errno != EINTR && errno != EINPROGRESS &&
     errno != EAGAIN && errno != EWOULDBLOCK
#ifdef _WIN32
     && WSAGetLastError() != WSAEINTR && WSAGetLastError() != WSAEWOULDBLOCK
#endif
    );
}